

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O2

t_operand __thiscall
xemmai::ast::t_if::f_emit(t_if *this,t_emit *a_emit,bool a_tail,bool a_operand,bool a_clear)

{
  t_block *a_junction;
  t_node *ptVar1;
  size_t sVar2;
  t_label *a_label;
  t_emit *ptVar3;
  t_label *a_label_00;
  anon_union_8_4_0f1077ea_for_t_operand_2 extraout_RDX;
  t_operand tVar4;
  vector<bool,_std::allocator<bool>_> privates;
  
  ptVar1 = (this->v_condition)._M_t.
           super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>.
           _M_t.
           super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>.
           super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl;
  (*ptVar1->_vptr_t_node[3])(ptVar1,a_emit,0,0,0);
  a_label = t_emit::f_label(a_emit);
  a_emit->v_stack = a_emit->v_stack - 1;
  ptVar3 = t_emit::operator<<(a_emit,c_instruction__BRANCH);
  ptVar3 = t_emit::operator<<(ptVar3,a_emit->v_stack);
  t_emit::operator<<(ptVar3,a_label);
  std::vector<bool,_std::allocator<bool>_>::vector(&privates,a_emit->v_privates);
  sVar2 = a_emit->v_stack;
  anon_unknown_11::f_emit_block(a_emit,&this->v_true,a_tail,a_clear,this->v_preserve);
  a_junction = &this->v_junction;
  t_emit::f_join(a_emit,a_junction);
  a_label_00 = t_emit::f_label(a_emit);
  ptVar3 = t_emit::operator<<(a_emit,c_instruction__JUMP);
  t_emit::operator<<(ptVar3,a_label_00);
  a_label->v_target =
       (long)(a_emit->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(a_emit->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  std::vector<bool,_std::allocator<bool>_>::operator=(a_emit->v_privates,&privates);
  a_emit->v_stack = sVar2;
  anon_unknown_11::f_emit_block(a_emit,&this->v_false,a_tail,a_clear,this->v_preserve);
  t_emit::f_join(a_emit,a_junction);
  a_label_00->v_target =
       (long)(a_emit->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(a_emit->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  t_emit::f_merge(a_emit,a_junction);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&privates.super__Bvector_base<std::allocator<bool>_>);
  tVar4.field_1.v_integer = extraout_RDX.v_integer;
  tVar4._0_8_ = 4;
  return tVar4;
}

Assistant:

t_operand t_if::f_emit(t_emit& a_emit, bool a_tail, bool a_operand, bool a_clear)
{
	v_condition->f_emit(a_emit, false, false);
	auto& label0 = a_emit.f_label();
	a_emit.f_pop();
	a_emit << c_instruction__BRANCH << a_emit.v_stack << label0;
	auto privates = *a_emit.v_privates;
	auto stack = a_emit.v_stack;
	f_emit_block(a_emit, v_true, a_tail, a_clear, v_preserve);
	a_emit.f_join(v_junction);
	auto& label1 = a_emit.f_label();
	a_emit << c_instruction__JUMP << label1;
	a_emit.f_target(label0);
	*a_emit.v_privates = privates;
	a_emit.v_stack = stack;
	f_emit_block(a_emit, v_false, a_tail, a_clear, v_preserve);
	a_emit.f_join(v_junction);
	a_emit.f_target(label1);
	a_emit.f_merge(v_junction);
	return {};
}